

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O3

double YP_md_get_joint_vel(YPSpur *spur,int id,double *v)

{
  int iVar1;
  YPSpur_msg msg;
  YPSpur_msg local_48;
  
  local_48.msg_type = 1;
  local_48.pid = (long)spur->pid;
  local_48.type = 0x820;
  local_48.cs = id;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_48);
  if ((-1 < iVar1) && (iVar1 = (*(spur->dev).recv)(&spur->dev,&local_48), -1 < iVar1)) {
    *v = local_48.data[0];
    return local_48.data[1];
  }
  spur->connection_error = 1;
  return -1.0;
}

Assistant:

double YP_md_get_joint_vel(YPSpur* spur, int id, double* v)
{
  YPSpur_msg msg;
  int len;
  double time;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_GET_JOINT_VEL;
  msg.cs = id;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  *v = msg.data[0];
  time = msg.data[1];
  return time;
}